

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O2

void __thiscall
Iir::ChebyshevI::AnalogLowShelf::design
          (AnalogLowShelf *this,int numPoles,double gainDb,double rippleDb)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  double local_b8;
  undefined4 local_88;
  undefined4 uStack_84;
  complex_t local_68;
  double local_58;
  double dStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (this->m_numPoles == numPoles) {
    if ((this->m_rippleDb == rippleDb) && (!NAN(this->m_rippleDb) && !NAN(rippleDb))) {
      if ((this->m_gainDb == gainDb) && (!NAN(this->m_gainDb) && !NAN(gainDb))) {
        return;
      }
    }
  }
  this->m_numPoles = numPoles;
  this->m_rippleDb = rippleDb;
  this->m_gainDb = gainDb;
  (this->super_LayoutBase).m_numPoles = 0;
  uVar3 = -(ulong)(ABS(gainDb) <= rippleDb);
  uVar9 = ~uVar3 & (ulong)rippleDb | (ulong)ABS(gainDb) & uVar3;
  uVar3 = -(ulong)(-gainDb < gainDb);
  local_b8 = (double)((uVar9 ^ 0x8000000000000000) & uVar3 | ~uVar3 & uVar9);
  dVar4 = pow(10.0,gainDb / -20.0);
  dVar5 = pow(10.0,(-gainDb - local_b8) / 20.0);
  if ((dVar5 != 1.0) || (NAN(dVar5))) {
    dVar6 = (dVar4 * dVar4 + -dVar5 * dVar5) / (dVar5 * dVar5 + -1.0);
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
  }
  else {
    dVar6 = dVar4 + -1.0;
  }
  dVar7 = SQRT(1.0 / (dVar6 * dVar6) + 1.0);
  dVar4 = pow(dVar5 * dVar7 + dVar4 / dVar6,1.0 / (double)numPoles);
  dVar4 = log(dVar4);
  dVar5 = pow(1.0 / dVar6 + dVar7,1.0 / (double)numPoles);
  dVar5 = log(dVar5);
  dVar6 = sinh(dVar4);
  dVar7 = sinh(dVar5);
  dVar4 = cosh(dVar4);
  dVar5 = cosh(dVar5);
  local_88 = SUB84(dVar7,0);
  uStack_84 = (undefined4)((ulong)dVar7 >> 0x20);
  uStack_40 = SUB84(dVar5,0);
  uStack_3c = (undefined4)((ulong)dVar5 >> 0x20);
  local_48 = local_88;
  uStack_44 = uStack_84;
  iVar2 = 1;
  for (iVar1 = 1; iVar1 <= numPoles / 2; iVar1 = iVar1 + 1) {
    dVar5 = ((double)iVar2 * 3.141592653589793) / (double)(numPoles * 2);
    dVar8 = sin(dVar5);
    dVar5 = cos(dVar5);
    local_58 = dVar6 * -dVar8;
    dStack_50 = dVar4 * dVar5;
    dVar5 = dVar5 * (double)CONCAT44(uStack_3c,uStack_40);
    local_68._M_value._8_4_ = SUB84(dVar5,0);
    local_68._M_value._0_8_ = -dVar8 * (double)CONCAT44(uStack_44,local_48);
    local_68._M_value._12_4_ = (int)((ulong)dVar5 >> 0x20);
    LayoutBase::addPoleZeroConjugatePairs(&this->super_LayoutBase,(complex_t *)&local_58,&local_68);
    iVar2 = iVar2 + 2;
  }
  if ((numPoles & 1U) != 0) {
    local_58 = -dVar6;
    dStack_50 = 0.0;
    local_68._M_value._8_8_ = 0;
    local_68._M_value._0_8_ = -dVar7;
    LayoutBase::add(&this->super_LayoutBase,(complex_t *)&local_58,&local_68);
  }
  return;
}

Assistant:

void AnalogLowShelf::design (int numPoles,
                             double gainDb,
                             double rippleDb)
{
  if (m_numPoles != numPoles ||
      m_rippleDb != rippleDb ||
      m_gainDb != gainDb)
  {
    m_numPoles = numPoles;
    m_rippleDb = rippleDb;
    m_gainDb = gainDb;

    reset ();

    gainDb = -gainDb;

    if (rippleDb >= fabs(gainDb))
      rippleDb = fabs (gainDb);
    if (gainDb<0)
      rippleDb = -rippleDb;

    const double G  = std::pow (10., gainDb / 20.0 );
    const double Gb = std::pow (10., (gainDb - rippleDb) / 20.0);
    const double G0 = 1;
    const double g0 = pow (G0 , 1. / numPoles);

    double eps;
    if (Gb != G0 )
      eps = sqrt((G*G-Gb*Gb)/(Gb*Gb-G0*G0));
    else
      eps = G-1; // This is surely wrong

    const double b = pow (G/eps+Gb*sqrt(1+1/(eps*eps)), 1./numPoles);
    const double u = log (b / g0);
    const double v = log (pow (1. / eps+sqrt(1+1/(eps*eps)),1./numPoles));
    
    const double sinh_u = sinh (u);
    const double sinh_v = sinh (v);
    const double cosh_u = cosh (u);
    const double cosh_v = cosh (v);
    const double n2 = 2 * numPoles;
    const int pairs = numPoles / 2;
    for (int i = 1; i <= pairs; ++i)
    {
      const double a = doublePi * (2 * i - 1) / n2;
      const double sn = sin (a);
      const double cs = cos (a);
      addPoleZeroConjugatePairs (complex_t (-sn * sinh_u, cs * cosh_u),
                                       complex_t (-sn * sinh_v, cs * cosh_v));
    }

    if (numPoles & 1)
      add (-sinh_u, -sinh_v);
  }
}